

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::api::json::ElementsDecodeIssuance::ElementsDecodeIssuance(ElementsDecodeIssuance *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::ElementsDecodeIssuance>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ElementsDecodeIssuance_00742598;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->asset_blinding_nonce_)._M_dataplus._M_p = (pointer)&(this->asset_blinding_nonce_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->asset_blinding_nonce_,"");
  (this->asset_entropy_)._M_dataplus._M_p = (pointer)&(this->asset_entropy_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->asset_entropy_,"");
  (this->contract_hash_)._M_dataplus._M_p = (pointer)&(this->contract_hash_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->contract_hash_,"");
  this->isreissuance_ = false;
  (this->token_)._M_dataplus._M_p = (pointer)&(this->token_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->token_,"");
  (this->asset_)._M_dataplus._M_p = (pointer)&(this->asset_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->asset_,"");
  this->assetamount_ = 0;
  (this->assetamountcommitment_)._M_dataplus._M_p = (pointer)&(this->assetamountcommitment_).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->assetamountcommitment_,"");
  this->tokenamount_ = 0;
  (this->tokenamountcommitment_)._M_dataplus._M_p = (pointer)&(this->tokenamountcommitment_).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->tokenamountcommitment_,"");
  (this->asset_rangeproof_)._M_dataplus._M_p = (pointer)&(this->asset_rangeproof_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->asset_rangeproof_,"");
  (this->token_rangeproof_)._M_dataplus._M_p = (pointer)&(this->token_rangeproof_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->token_rangeproof_,"");
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeIssuance() {
    CollectFieldName();
  }